

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_horde_bull(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  CHAR_DATA *in_RSI;
  void *arg1;
  int in_stack_000000dc;
  CHAR_DATA *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  bVar1 = is_affected(in_RSI,(int)gsn_rage);
  if ((bVar1) && (in_RSI->fighting != (CHAR_DATA *)0x0)) {
    iVar2 = number_percent();
    arg1 = (void *)(double)iVar2;
    iVar2 = get_skill(in_stack_000000e0,in_stack_000000dc);
    if (((double)arg1 <= (double)iVar2 * 0.1) && (in_RSI->hit < (int)in_RSI->max_hit)) {
      send_to_char((char *)in_RSI,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      act((char *)in_RSI,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
          arg1,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      number_range((int)arg1,in_RSI->hit);
      piVar3 = std::min<int>((int *)&stack0xffffffffffffffec,(int *)&stack0xffffffffffffffe8);
      in_RSI->hit = *piVar3;
    }
  }
  return;
}

Assistant:

void fight_prog_horde_bull(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_affected(ch, gsn_rage) || !ch->fighting || number_percent() > (.1 * get_skill(ch, gsn_rage)))
		return;

	if (ch->hit >= ch->max_hit)
		return;

	send_to_char("The fortitude of the Bull fills you, inspiring you to ignore your pain and fight on.\n\r", ch);
	act("$n's muscles ripple with fresh vigor as $s eyes harden with new resolve.", ch, 0, 0, TO_ROOM);

	ch->hit = std::min((int)ch->max_hit, ch->hit + number_range(ch->level * (short)1.2, ch->level * (short)2.2));
}